

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall
lexer_exception::lexer_exception(lexer_exception *this,LexerPosition *position,string *msg)

{
  string *__rhs;
  int iVar1;
  ostream *poVar2;
  stringstream buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  *(undefined ***)this = &PTR__lexer_exception_001599c8;
  (this->position_).super_Position._vptr_Position = (_func_int **)&PTR_clear_001599b0;
  iVar1 = (position->super_Position).col_;
  (this->position_).super_Position.row_ = (position->super_Position).row_;
  (this->position_).super_Position.col_ = iVar1;
  (this->position_).super_Position._vptr_Position = (_func_int **)&PTR_clear_00159970;
  __rhs = &this->msg_;
  std::__cxx11::string::string((string *)__rhs,(string *)msg);
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(local_190,anon_var_dwarf_8b402 + 9);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->position_).super_Position.row_);
  poVar2 = std::operator<<(poVar2,anon_var_dwarf_3ac02);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->position_).super_Position.col_);
  std::operator<<(poVar2,anon_var_dwarf_3ac1b);
  std::__cxx11::stringbuf::str();
  std::operator+(&local_1c0,&local_1e0,__rhs);
  std::__cxx11::string::operator=((string *)__rhs,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

explicit lexer_exception(const LexerPosition &position, const std::string &msg) : position_(position), msg_(msg) {
        std::stringstream buffer;
        buffer << "第 " << position_.row() << " 行 第 " << position_.col() << " 列: ";
        msg_ = buffer.str() + msg_;
    }